

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

aiMatrix4x4 * get_world_transform(aiMatrix4x4 *__return_storage_ptr__,aiNode *node,aiScene *scene)

{
  bool bVar1;
  reference ppaVar2;
  undefined1 local_50 [16];
  reverse_iterator n;
  undefined1 local_30 [8];
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> node_chain;
  aiScene *scene_local;
  aiNode *node_local;
  
  node_chain.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)scene;
  scene_local = (aiScene *)node;
  std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>::vector
            ((vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *)local_30);
  for (; (aiNode *)scene_local !=
         node_chain.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage[1];
      scene_local = (aiScene *)scene_local[8].mTextures) {
    std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>::push_back
              ((vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *)local_30,
               (value_type *)&scene_local);
  }
  aiMatrix4x4t<float>::aiMatrix4x4t(__return_storage_ptr__);
  std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>::rbegin
            ((vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *)(local_50 + 8));
  while( true ) {
    std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>::rend
              ((vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *)local_50);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_aiNode_**,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>_>
                             *)(local_50 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_aiNode_**,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>_>
                             *)local_50);
    if (!bVar1) break;
    ppaVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_aiNode_**,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_aiNode_**,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>_>
                           *)(local_50 + 8));
    aiMatrix4x4t<float>::operator*=(__return_storage_ptr__,&(*ppaVar2)->mTransformation);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_aiNode_**,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_aiNode_**,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>_>
                  *)(local_50 + 8));
  }
  std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>::~vector
            ((vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 get_world_transform(const aiNode* node, const aiScene* scene)
{
    std::vector<const aiNode*> node_chain;
    while (node != scene->mRootNode) {
        node_chain.push_back(node);
        node = node->mParent;
    }
    aiMatrix4x4 transform;
    for (auto n = node_chain.rbegin(); n != node_chain.rend(); ++n) {
        transform *= (*n)->mTransformation;
    }
    return transform;
}